

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,ExpressionStatement *stmt)

{
  bool bVar1;
  AssignmentExpression *pAVar2;
  SmallVectorBase<const_slang::ast::Statement_*> *in_RSI;
  ExpressionStatement *in_RDI;
  AssignmentExpression *assignment;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_ffffffffffffffe0;
  
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
            (in_stack_ffffffffffffffe0,in_RDI);
  if ((*(int *)in_RSI[1].data_ == 0xe) &&
     (pAVar2 = ast::Expression::as<slang::ast::AssignmentExpression>((Expression *)in_RSI[1].data_),
     pAVar2->timingControl != (TimingControl *)0x0)) {
    bVar1 = ast::TimingControl::bad(pAVar2->timingControl);
    (in_RDI->super_Statement).sourceRange.startLoc.field_0x4 =
         ((in_RDI->super_Statement).sourceRange.startLoc.field_0x4 & 1) != 0 || bVar1;
    SmallVectorBase<const_slang::ast::Statement_*>::push_back(in_RSI,(Statement **)in_RDI);
  }
  return;
}

Assistant:

void DataFlowAnalysis::handle(const ExpressionStatement& stmt) {
    visitStmt(stmt);

    if (stmt.expr.kind == ExpressionKind::Assignment) {
        auto& assignment = stmt.expr.as<AssignmentExpression>();
        if (assignment.timingControl) {
            bad |= assignment.timingControl->bad();
            timedStatements.push_back(&stmt);
        }
    }
}